

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O2

err_t beltHMAC(octet *mac,void *src,size_t count,octet *key,size_t len)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  
  bVar1 = memIsValid(src,count);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(key,len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(mac,0x20);
      if (bVar1 != 0) {
        size = beltHMAC_keep();
        state = blobCreate(size);
        if (state == (blob_t)0x0) {
          eVar2 = 0x6e;
        }
        else {
          beltHMACStart(state,key,len);
          beltHMACStepA(src,count,state);
          beltHMACStepG(mac,state);
          blobClose(state);
          eVar2 = 0;
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltHMAC(octet mac[32], const void* src, size_t count,
	const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(mac, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// выработать имитовставку
	beltHMACStart(state, key, len);
	beltHMACStepA(src, count, state);
	beltHMACStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}